

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O3

void __thiscall FIX::DataDictionary::setVersion(DataDictionary *this,string *beginString)

{
  pointer pcVar1;
  undefined1 local_70 [16];
  _Alloc_hider local_60;
  char local_50 [16];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  size_t local_20;
  int local_18;
  
  local_70._0_8_ = &PTR__FieldBase_001ea6e0;
  local_70._8_4_ = 8;
  local_60._M_p = local_50;
  pcVar1 = (beginString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + beginString->_M_string_length);
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_20 = 0;
  local_18 = 0;
  local_70._0_8_ = &PTR__FieldBase_001ea660;
  (this->m_beginString).super_StringField.super_FieldBase.m_tag = local_70._8_4_;
  std::__cxx11::string::_M_assign
            ((string *)&(this->m_beginString).super_StringField.super_FieldBase.m_string);
  (this->m_beginString).super_StringField.super_FieldBase.m_metrics.m_checksum = local_18;
  (this->m_beginString).super_StringField.super_FieldBase.m_metrics.m_length = local_20;
  (this->m_beginString).super_StringField.super_FieldBase.m_data._M_string_length = 0;
  *(this->m_beginString).super_StringField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
  FieldBase::~FieldBase((FieldBase *)local_70);
  this->m_hasVersion = true;
  return;
}

Assistant:

void setVersion( const std::string& beginString )
  {
    m_beginString = beginString;
    m_hasVersion = true;
  }